

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O2

Value * __thiscall iqxmlrpc::Value::operator[](Value *this,char *s)

{
  Struct *this_00;
  Value *pVVar1;
  allocator<char> local_39;
  string local_38;
  
  this_00 = cast<iqxmlrpc::Struct>(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,s,&local_39);
  pVVar1 = Struct::operator[](this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return pVVar1;
}

Assistant:

Value& Value::operator []( const char* s )
{
  return (*cast<Struct>())[s];
}